

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  bool bVar1;
  FILE *__stream;
  undefined8 extraout_RAX;
  string *this_00;
  size_type *this_01;
  stringstream asStack_220 [16];
  ostream aoStack_210 [112];
  ios_base aiStack_1a0 [264];
  string sStack_98;
  FilePath FStack_78;
  FilePath FStack_58;
  XmlUnitTestResultPrinter *pXStack_38;
  allocator local_11;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_00153590;
  this_00 = &this->output_file_;
  std::__cxx11::string::string((string *)this_00,output_file,&local_11);
  if (((this->output_file_)._M_dataplus._M_p != (pointer)0x0) &&
     ((this->output_file_)._M_string_length != 0)) {
    return;
  }
  internal::XmlUnitTestResultPrinter();
  this_01 = &this_00->_M_string_length;
  pXStack_38 = this;
  FilePath::FilePath(&FStack_78,(string *)this_01);
  FilePath::RemoveFileName(&FStack_58,&FStack_78);
  bVar1 = FilePath::CreateDirectoriesRecursively(&FStack_58);
  if (bVar1) {
    __stream = fopen((char *)*this_01,"w");
    if (__stream != (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream(asStack_220);
      PrintXmlUnitTest(aoStack_210,(UnitTest *)output_file);
      StringStreamToString(&sStack_98,(stringstream *)asStack_220);
      fputs(sStack_98._M_dataplus._M_p,__stream);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_98._M_dataplus._M_p != &sStack_98.field_2) {
        operator_delete(sStack_98._M_dataplus._M_p);
      }
      fclose(__stream);
      std::__cxx11::stringstream::~stringstream(asStack_220);
      std::ios_base::~ios_base(aiStack_1a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)FStack_58.pathname_._M_dataplus._M_p != &FStack_58.pathname_.field_2) {
        operator_delete(FStack_58.pathname_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)FStack_78.pathname_._M_dataplus._M_p != &FStack_78.pathname_.field_2) {
        operator_delete(FStack_78.pathname_._M_dataplus._M_p);
      }
      return;
    }
  }
  OnTestIterationEnd((XmlUnitTestResultPrinter *)this_01);
  std::__cxx11::stringstream::~stringstream(asStack_220);
  std::ios_base::~ios_base(aiStack_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FStack_58.pathname_._M_dataplus._M_p != &FStack_58.pathname_.field_2) {
    operator_delete(FStack_58.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)FStack_78.pathname_._M_dataplus._M_p != &FStack_78.pathname_.field_2) {
    operator_delete(FStack_78.pathname_._M_dataplus._M_p);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.c_str() == NULL || output_file_.empty()) {
    fprintf(stderr, "XML output file may not be null\n");
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
}